

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listimagewindow.cc
# Opt level: O1

void __thiscall bgui::ListImageWindow::set(ListImageWindow *this,int pos,int w,int h,bool size_max)

{
  pointer ppIVar1;
  ImageAdapterBase *adapter;
  double dVar2;
  keep k;
  
  if ((-1 < pos) &&
     (ppIVar1 = (this->list).
                super__Vector_base<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
     pos < (int)((ulong)((long)(this->list).
                               super__Vector_base<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3))) {
    dVar2 = this->imax;
    adapter = ppIVar1[(uint)pos];
    k = this->kp;
    if (k == keep_all && this->imin < dVar2) {
      adapter->imin = this->imin;
      adapter->imax = dVar2;
    }
    if (h < 1 || w < 1) {
      if (k == keep_none) {
        adapter->map = this->map;
        adapter->channel = this->channel;
      }
      size_max = false;
      w = -1;
      h = -1;
    }
    else {
      adapter->map = this->map;
      adapter->channel = this->channel;
      k = keep_none;
    }
    ImageWindow::setAdapter(&this->super_ImageWindow,adapter,false,k,w,h,size_max);
  }
  updateTitle(this);
  return;
}

Assistant:

void ListImageWindow::set(int pos, int w, int h, bool size_max)
{
  if (pos >= 0 && pos < static_cast<int>(list.size()))
  {
    ImageAdapterBase *adapt=list[pos];

    if (imin < imax && kp == keep_all)
    {
      adapt->setMinIntensity(imin);
      adapt->setMaxIntensity(imax);
    }

    if (w > 0 && h > 0)
    {
      adapt->setMapping(map);
      adapt->setChannel(channel);
      setAdapter(adapt, false, keep_none, w, h, size_max);
    }
    else
    {
      if (kp == keep_none)
      {
        adapt->setMapping(map);
        adapt->setChannel(channel);
      }

      setAdapter(adapt, false, kp);
    }
  }

  updateTitle();
}